

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall Diligent::GLContextState::EnableDepthTest(GLContextState *this,bool bEnable)

{
  ENABLE_STATE EVar1;
  undefined7 in_register_00000031;
  GLenum err;
  string msg;
  uint local_4c;
  string local_48;
  
  EVar1 = DISABLED - (int)CONCAT71(in_register_00000031,bEnable);
  if ((this->m_DSState).m_DepthEnableState.m_EnableState == EVar1) {
    return;
  }
  if (bEnable) {
    glEnable();
    local_4c = glGetError();
    if (local_4c == 0) goto LAB_00163243;
    LogError<false,char[28],char[17],unsigned_int>
              (false,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1da,(char (*) [28])"Failed to enable depth test",
               (char (*) [17])"\nGL Error Code: ",&local_4c);
    FormatString<char[6]>(&local_48,(char (*) [6])0x32952e);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1da);
  }
  else {
    glDisable();
    local_4c = glGetError();
    if (local_4c == 0) goto LAB_00163243;
    LogError<false,char[29],char[17],unsigned_int>
              (false,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1df,(char (*) [29])"Failed to disable depth test",
               (char (*) [17])"\nGL Error Code: ",&local_4c);
    FormatString<char[6]>(&local_48,(char (*) [6])0x32952e);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"EnableDepthTest",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x1df);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_00163243:
  (this->m_DSState).m_DepthEnableState.m_EnableState = EVar1;
  return;
}

Assistant:

void GLContextState::EnableDepthTest(bool bEnable)
{
    if (m_DSState.m_DepthEnableState != bEnable)
    {
        if (bEnable)
        {
            glEnable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to enable depth test");
        }
        else
        {
            glDisable(GL_DEPTH_TEST);
            DEV_CHECK_GL_ERROR("Failed to disable depth test");
        }
        m_DSState.m_DepthEnableState = bEnable;
    }
}